

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *lhsValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rowVec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhsValue,bool scale)

{
  type_conflict5 tVar1;
  int iVar2;
  ulong *puVar3;
  int *piVar4;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  byte in_R8B;
  int k;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int i;
  int j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  DataArray<int> *colscaleExp;
  int newRowScaleExp;
  int oldColNumber;
  int idx;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  int in_stack_fffffffffffff680;
  int in_stack_fffffffffffff684;
  int in_stack_fffffffffffff688;
  int in_stack_fffffffffffff68c;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff690;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff698;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *plhs;
  int local_92c;
  int in_stack_fffffffffffff70c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff710;
  undefined1 local_788 [128];
  undefined1 local_708 [128];
  undefined1 local_688 [128];
  int local_608;
  uint local_604;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_600;
  undefined1 local_5f8 [128];
  undefined1 local_578 [128];
  undefined1 local_4f8 [128];
  undefined1 local_478 [128];
  ulong local_3f8;
  undefined1 local_3f0 [128];
  undefined1 local_370 [128];
  undefined1 local_2f0 [128];
  undefined1 local_270 [128];
  DataArray<int> *local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined1 local_1e0 [128];
  int local_160;
  int local_15c;
  int local_158;
  byte local_151;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined8 local_118;
  ulong *local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined4 *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined4 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_151 = in_R8B & 1;
  local_150 = in_RCX;
  local_148 = in_RDX;
  local_140 = in_RSI;
  local_158 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x69ebb5);
  local_15c = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x69ebc6);
  local_160 = 0;
  local_1e4 = 0;
  local_f0 = local_1e0;
  local_f8 = &local_1e4;
  local_100 = 0;
  plhs = local_148;
  local_98 = local_f8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff690,
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (type *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
  local_1e8 = 0;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(local_150,plhs,local_140,in_stack_fffffffffffff698,&in_stack_fffffffffffff690->up,
        (int *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  local_1f0 = (DataArray<int> *)(in_RDI + 0x2f);
  if ((local_151 & 1) != 0) {
    local_160 = (**(code **)(*(long *)in_RDI[0x43] + 8))((long *)in_RDI[0x43],local_148,local_1f0);
    rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),in_stack_fffffffffffff67c);
    local_128 = infinity();
    local_120 = local_270;
    local_130 = 0;
    local_8 = local_128;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff690,
               (double)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
               (type *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x69ed64);
    if (tVar1) {
      local_e8 = rhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                       in_stack_fffffffffffff67c);
      local_e0 = local_370;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
      local_58 = rhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                       in_stack_fffffffffffff67c);
      local_60 = local_2f0;
      local_50 = local_60;
      local_18 = local_60;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    }
    in_stack_fffffffffffff690 =
         (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                in_stack_fffffffffffff67c);
    puVar3 = (ulong *)infinity();
    local_3f8 = *puVar3 ^ 0x8000000000000000;
    local_108 = local_3f0;
    local_110 = &local_3f8;
    local_118 = 0;
    local_10 = local_110;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff690,
               (double)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
               (type *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x69eecf);
    if (tVar1) {
      local_d8 = lhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                       in_stack_fffffffffffff67c);
      local_d0 = local_4f8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
      local_68 = lhs_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                       in_stack_fffffffffffff67c);
      local_70 = local_478;
      local_48 = local_70;
      local_20 = local_70;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    }
    local_c8 = maxRowObj_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                           in_stack_fffffffffffff67c);
    local_c0 = local_5f8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
    local_78 = maxRowObj_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                           in_stack_fffffffffffff67c);
    local_80 = local_578;
    local_40 = local_80;
    local_28 = local_80;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    in_stack_fffffffffffff68c = local_160;
    piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),local_158);
    *piVar4 = in_stack_fffffffffffff68c;
  }
  local_600 = rowVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                          in_stack_fffffffffffff67c);
  local_604 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(local_600);
  uVar5 = extraout_RDX;
  while (local_604 = local_604 - 1, -1 < (int)local_604) {
    piVar4 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_600,(char *)(ulong)local_604,(int)uVar5);
    local_608 = *piVar4;
    if ((local_151 & 1) != 0) {
      local_b8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_600,local_604);
      local_b0 = local_708;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      in_stack_fffffffffffff688 = local_160;
      DataArray<int>::operator[](local_1f0,local_608);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
      local_88 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_600,local_604);
      local_90 = local_688;
      local_38 = local_90;
      local_30 = local_90;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    }
    local_a8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_600,local_604);
    local_a0 = local_788;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    in_stack_fffffffffffff684 = local_608;
    iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x69f20c);
    if (iVar2 <= in_stack_fffffffffffff684) {
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::LPColBase(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
      in_stack_fffffffffffff680 =
           nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x69f22c);
      for (local_92c = in_stack_fffffffffffff680; local_92c <= local_608; local_92c = local_92c + 1)
      {
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff690,
              (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      }
      LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x69f295);
    }
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,in_stack_fffffffffffff688,
           (int *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    uVar5 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x280))(in_RDI,1);
  iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x69f2f5);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar2 - local_15c);
  return;
}

Assistant:

void doAddRow(const R& lhsValue, const SVectorBase<R>& rowVec, const R& rhsValue,
                 bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(lhsValue, rowVec, rhsValue);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(rowVec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      SVectorBase<R>& vec = rowVector_w(idx);

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }